

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

iterator __thiscall re2::SparseArray<int>::set_existing(SparseArray<int> *this,int i,int v)

{
  uint uVar1;
  uint uVar2;
  pointer pIVar3;
  
  uVar1 = this->size_;
  if ((int)uVar1 < 0) {
    __assert_fail("(0) <= (size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c4,"void re2::SparseArray<int>::DebugCheckInvariants() const [Value = int]");
  }
  if (this->max_size_ < (int)uVar1) {
    __assert_fail("(size_) <= (max_size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c5,"void re2::SparseArray<int>::DebugCheckInvariants() const [Value = int]");
  }
  if (this->sparse_to_dense_ != (int *)0x0 || uVar1 == 0) {
    if (i < 0) {
      __assert_fail("(i) >= (0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x134,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
    }
    if ((uint)this->max_size_ <= (uint)i) {
      __assert_fail("(i) < (max_size_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x135,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
    }
    uVar2 = this->sparse_to_dense_[(uint)i];
    if ((uVar1 <= uVar2) ||
       (pIVar3 = (this->dense_).
                 super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                 ._M_impl.super__Vector_impl_data._M_start, pIVar3[uVar2].index_ != i)) {
      __assert_fail("has_index(i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x176,
                    "typename SparseArray<Value>::iterator re2::SparseArray<int>::set_existing(int, Value) [Value = int]"
                   );
    }
    pIVar3[uVar2].second = v;
    if (this->sparse_to_dense_ != (int *)0x0) {
      return (iterator)(pIVar3 + this->sparse_to_dense_[(uint)i]);
    }
  }
  __assert_fail("size_ == 0 || sparse_to_dense_ != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x1c6,"void re2::SparseArray<int>::DebugCheckInvariants() const [Value = int]");
}

Assistant:

typename SparseArray<Value>::iterator
SparseArray<Value>::set_existing(int i, Value v) {
  DebugCheckInvariants();
  DCHECK(has_index(i));
  dense_[sparse_to_dense_[i]].second = v;
  DebugCheckInvariants();
  return dense_.begin() + sparse_to_dense_[i];
}